

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

dgEdge * __thiscall
dgPolyhedra::TriangulateFace
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *faceNormalOut)

{
  HaI32 HVar1;
  HaI32 HVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  undefined1 auVar5 [16];
  int iVar6;
  dgEdge *pdVar7;
  dgEdge *pdVar8;
  dgEdge *pdVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  dgBigVector normal;
  dgBigVector local_98;
  dgTemplateVector<double> local_78;
  dgBigVector local_50;
  
  iVar6 = 0x3fff;
  pdVar7 = face;
  do {
    bVar10 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar10) {
      __assert_fail("perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xbe6,
                    "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
                   );
    }
    pdVar7 = pdVar7->m_next;
  } while (pdVar7 != face);
  if (iVar6 == 0) {
    __assert_fail("(perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xbea,
                  "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
                 );
  }
  FaceNormal(&local_98,(dgPolyhedra *)face,face,pool,stride * 8);
  auVar5._8_8_ = local_98.super_dgTemplateVector<double>.m_y;
  auVar5._0_8_ = local_98.super_dgTemplateVector<double>.m_x;
  auVar11._0_8_ =
       local_98.super_dgTemplateVector<double>.m_x * local_98.super_dgTemplateVector<double>.m_x;
  auVar11._8_8_ =
       local_98.super_dgTemplateVector<double>.m_y * local_98.super_dgTemplateVector<double>.m_y;
  auVar11 = vshufpd_avx(auVar11,auVar11,1);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_98.super_dgTemplateVector<double>.m_z;
  auVar11 = vfmadd231sd_fma(auVar11,auVar5,auVar5);
  auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar12);
  if (9.999999960041972e-13 <= auVar11._0_8_) {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    local_78.m_y = 1.0 / auVar11._0_8_;
    local_78.m_z = local_78.m_y * local_98.super_dgTemplateVector<double>.m_z;
    local_78.m_x = local_78.m_y * local_98.super_dgTemplateVector<double>.m_x;
    local_78.m_y = local_78.m_y * local_98.super_dgTemplateVector<double>.m_y;
    local_78.m_w = local_98.super_dgTemplateVector<double>.m_w;
    dgBigVector::dgBigVector(&local_50,&local_78);
    local_98.super_dgTemplateVector<double>.m_x = local_50.super_dgTemplateVector<double>.m_x;
    local_98.super_dgTemplateVector<double>.m_y = local_50.super_dgTemplateVector<double>.m_y;
    local_98.super_dgTemplateVector<double>.m_z = local_50.super_dgTemplateVector<double>.m_z;
    local_98.super_dgTemplateVector<double>.m_w = local_50.super_dgTemplateVector<double>.m_w;
    if (faceNormalOut != (dgBigVector *)0x0) {
      (faceNormalOut->super_dgTemplateVector<double>).m_x =
           local_50.super_dgTemplateVector<double>.m_x;
      (faceNormalOut->super_dgTemplateVector<double>).m_y =
           local_50.super_dgTemplateVector<double>.m_y;
      (faceNormalOut->super_dgTemplateVector<double>).m_z =
           local_50.super_dgTemplateVector<double>.m_z;
      (faceNormalOut->super_dgTemplateVector<double>).m_w =
           local_50.super_dgTemplateVector<double>.m_w;
    }
    while (face->m_next->m_next->m_next != face) {
      pdVar7 = FindEarTip(this,face,pool,stride,heap,&local_98);
      if (pdVar7 == (dgEdge *)0x0) {
        return face;
      }
      pdVar8 = pdVar7->m_prev;
      if (face == pdVar8 || face == pdVar7) {
        face = pdVar8->m_prev;
      }
      pdVar8 = AddHalfEdge(this,pdVar7->m_next->m_incidentVertex,pdVar8->m_incidentVertex);
      if (pdVar8 == (dgEdge *)0x0) {
        return face;
      }
      pdVar9 = AddHalfEdge(this,pdVar7->m_prev->m_incidentVertex,pdVar7->m_next->m_incidentVertex);
      if (pdVar9 == (dgEdge *)0x0) {
        return face;
      }
      HVar1 = pdVar7->m_mark;
      pdVar8->m_mark = HVar1;
      pdVar3 = pdVar7->m_next;
      pdVar8->m_userData = pdVar3->m_userData;
      HVar2 = pdVar7->m_incidentFace;
      pdVar8->m_incidentFace = HVar2;
      pdVar9->m_mark = HVar1;
      pdVar4 = pdVar7->m_prev;
      pdVar9->m_userData = pdVar4->m_userData;
      pdVar9->m_incidentFace = HVar2;
      pdVar8->m_twin = pdVar9;
      pdVar9->m_twin = pdVar8;
      pdVar9->m_prev = pdVar4->m_prev;
      pdVar9->m_next = pdVar3;
      pdVar7->m_prev->m_prev->m_next = pdVar9;
      pdVar7->m_next->m_prev = pdVar9;
      pdVar8->m_next = pdVar7->m_prev;
      pdVar8->m_prev = pdVar7;
      pdVar7->m_prev->m_prev = pdVar8;
      pdVar7->m_next = pdVar8;
      (heap->super_dgHeapBase<dgEdge_*,_double>).m_curCount = 0;
    }
    face = (dgEdge *)0x0;
  }
  else if (faceNormalOut != (dgBigVector *)0x0) {
    (faceNormalOut->super_dgTemplateVector<double>).m_x = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_y = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_z = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_w = 0.0;
  }
  return face;
}

Assistant:

dgEdge* dgPolyhedra::TriangulateFace (dgEdge* face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, dgBigVector* const faceNormalOut)
{
	dgEdge* perimeter [1024 * 16]; 
	dgEdge* ptr = face;
	hacd::HaI32 perimeterCount = 0;
	do {
		perimeter[perimeterCount] = ptr;
		perimeterCount ++;
		HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));
		ptr = ptr->m_next;
	} while (ptr != face);
	perimeter[perimeterCount] = face;
	HACD_ASSERT ((perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));

	dgBigVector normal (FaceNormal (face, pool, hacd::HaI32 (stride * sizeof (hacd::HaF64))));

	hacd::HaF64 dot = normal % normal;
	if (dot < hacd::HaF64 (1.0e-12f)) {
		if (faceNormalOut) {
			*faceNormalOut = dgBigVector (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
		}
		return face;
	}
	normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
	if (faceNormalOut) {
		*faceNormalOut = normal;
	}


	while (face->m_next->m_next->m_next != face) {
		dgEdge* const ear = FindEarTip (face, pool, stride, heap, normal); 
		if (!ear) {
			return face;
		}
		if ((face == ear)	|| (face == ear->m_prev)) {
			face = ear->m_prev->m_prev;
		}
		dgEdge* const edge = AddHalfEdge (ear->m_next->m_incidentVertex, ear->m_prev->m_incidentVertex);
		if (!edge) {
			return face;
		}
		dgEdge* const twin = AddHalfEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex);
		if (!twin) {
			return face;
		}
		HACD_ASSERT (twin);


		edge->m_mark = ear->m_mark;
		edge->m_userData = ear->m_next->m_userData;
		edge->m_incidentFace = ear->m_incidentFace;

		twin->m_mark = ear->m_mark;
		twin->m_userData = ear->m_prev->m_userData;
		twin->m_incidentFace = ear->m_incidentFace;

		edge->m_twin = twin;
		twin->m_twin = edge;

		twin->m_prev = ear->m_prev->m_prev;
		twin->m_next = ear->m_next;
		ear->m_prev->m_prev->m_next = twin;
		ear->m_next->m_prev = twin;

		edge->m_next = ear->m_prev;
		edge->m_prev = ear;
		ear->m_prev->m_prev = edge;
		ear->m_next = edge;

		heap.Flush ();
	}
	return NULL;
}